

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  ImGuiContext *pIVar4;
  size_t __n;
  char *__dest;
  int iVar5;
  ImGuiContext *ctx;
  int iVar6;
  
  pIVar4 = GImGui;
  pcVar2 = (GImGui->ClipboardHandlerData).Data;
  if (pcVar2 != (char *)0x0) {
    (pIVar4->ClipboardHandlerData).Size = 0;
    (pIVar4->ClipboardHandlerData).Capacity = 0;
    piVar1 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + -1;
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    (pIVar4->ClipboardHandlerData).Data = (char *)0x0;
  }
  __n = strlen(text);
  iVar3 = (int)__n;
  iVar5 = iVar3 + 1;
  iVar6 = (pIVar4->ClipboardHandlerData).Capacity;
  if (iVar3 < iVar6) {
    __dest = (char *)0x0;
  }
  else {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
    pcVar2 = (pIVar4->ClipboardHandlerData).Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(__dest,pcVar2,(long)(pIVar4->ClipboardHandlerData).Size);
      pcVar2 = (pIVar4->ClipboardHandlerData).Data;
      if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    }
    (pIVar4->ClipboardHandlerData).Data = __dest;
    (pIVar4->ClipboardHandlerData).Capacity = iVar6;
  }
  (pIVar4->ClipboardHandlerData).Size = iVar5;
  if (iVar3 < 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    __dest = (pIVar4->ClipboardHandlerData).Data;
  }
  memcpy(__dest,text,__n);
  if ((pIVar4->ClipboardHandlerData).Size <= iVar3) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  (pIVar4->ClipboardHandlerData).Data[iVar3] = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.ClipboardHandlerData.clear();
    const char* text_end = text + strlen(text);
    g.ClipboardHandlerData.resize((int)(text_end - text) + 1);
    memcpy(&g.ClipboardHandlerData[0], text, (size_t)(text_end - text));
    g.ClipboardHandlerData[(int)(text_end - text)] = 0;
}